

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYs<int>,_ImPlot::TransformerLogLog>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYs<int>,_ImPlot::TransformerLogLog>
             *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  GetterXsYs<int> *pGVar8;
  TransformerLogLog *pTVar9;
  ImPlotPlot *pIVar10;
  ImDrawVert *pIVar11;
  uint *puVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ImPlotContext *pIVar17;
  ImPlotContext *pIVar18;
  uint uVar19;
  long lVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar34;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar35;
  float fVar36;
  
  pIVar17 = GImPlot;
  pGVar8 = this->Getter1;
  pTVar9 = this->Transformer;
  iVar5 = pGVar8->Count;
  lVar20 = (long)(((pGVar8->Offset + prim + 1) % iVar5 + iVar5) % iVar5) * (long)pGVar8->Stride;
  iVar5 = *(int *)((long)pGVar8->Ys + lVar20);
  dVar13 = log10((double)*(int *)((long)pGVar8->Xs + lVar20) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar10 = pIVar17->CurrentPlot;
  dVar1 = pIVar17->LogDenX;
  dVar2 = (pIVar10->XAxis).Range.Min;
  dVar3 = (pIVar10->XAxis).Range.Max;
  dVar14 = log10((double)iVar5 / pIVar10->YAxis[pTVar9->YAxis].Range.Min);
  pIVar18 = GImPlot;
  iVar5 = pTVar9->YAxis;
  pIVar10 = pIVar17->CurrentPlot;
  pGVar8 = this->Getter2;
  pTVar9 = this->Transformer;
  iVar6 = pGVar8->Count;
  lVar20 = (long)(((prim + 1 + pGVar8->Offset) % iVar6 + iVar6) % iVar6) * (long)pGVar8->Stride;
  auVar32._8_8_ = dVar14;
  auVar32._0_8_ = dVar13;
  iVar6 = *(int *)((long)pGVar8->Ys + lVar20);
  auVar15._8_4_ = SUB84(pIVar17->LogDenY[iVar5],0);
  auVar15._0_8_ = dVar1;
  auVar15._12_4_ = (int)((ulong)pIVar17->LogDenY[iVar5] >> 0x20);
  auVar33 = divpd(auVar32,auVar15);
  dVar1 = pIVar10->YAxis[iVar5].Range.Min;
  IVar4 = pIVar17->PixelRange[iVar5].Min;
  fVar21 = (float)(pIVar17->Mx *
                   (((double)(float)auVar33._0_8_ * (dVar3 - dVar2) + dVar2) -
                   (pIVar10->XAxis).Range.Min) + (double)IVar4.x);
  fVar23 = (float)(pIVar17->My[iVar5] *
                   (((double)(float)auVar33._8_8_ * (pIVar10->YAxis[iVar5].Range.Max - dVar1) +
                    dVar1) - dVar1) + (double)IVar4.y);
  dVar13 = log10((double)*(int *)((long)pGVar8->Xs + lVar20) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar10 = pIVar18->CurrentPlot;
  dVar1 = pIVar18->LogDenX;
  dVar2 = (pIVar10->XAxis).Range.Min;
  dVar3 = (pIVar10->XAxis).Range.Max;
  dVar14 = log10((double)iVar6 / pIVar10->YAxis[pTVar9->YAxis].Range.Min);
  iVar5 = pTVar9->YAxis;
  auVar26._8_8_ = dVar14;
  auVar26._0_8_ = dVar13;
  auVar33._8_4_ = SUB84(pIVar18->LogDenY[iVar5],0);
  auVar33._0_8_ = dVar1;
  auVar33._12_4_ = (int)((ulong)pIVar18->LogDenY[iVar5] >> 0x20);
  auVar33 = divpd(auVar26,auVar33);
  pIVar10 = pIVar18->CurrentPlot;
  dVar1 = pIVar10->YAxis[iVar5].Range.Min;
  IVar4 = pIVar18->PixelRange[iVar5].Min;
  fVar22 = (float)(pIVar18->Mx *
                   (((double)(float)auVar33._0_8_ * (dVar3 - dVar2) + dVar2) -
                   (pIVar10->XAxis).Range.Min) + (double)IVar4.x);
  fVar24 = (float)(pIVar18->My[iVar5] *
                   (((double)(float)auVar33._8_8_ * (pIVar10->YAxis[iVar5].Range.Max - dVar1) +
                    dVar1) - dVar1) + (double)IVar4.y);
  fVar28 = (this->P12).x;
  fVar29 = (this->P12).y;
  fVar31 = (this->P11).x;
  fVar34 = (this->P11).y;
  fVar25 = fVar23 * fVar31 - fVar21 * fVar34;
  fVar35 = fVar28 * fVar24 - fVar29 * fVar22;
  fVar31 = fVar31 - fVar21;
  fVar28 = fVar28 - fVar22;
  fVar30 = fVar29 - fVar24;
  fVar36 = fVar30 * fVar31 - (fVar34 - fVar23) * fVar28;
  auVar27._0_4_ = fVar25 * fVar28 - fVar35 * fVar31;
  auVar27._4_4_ = fVar25 * fVar30 - fVar35 * (fVar34 - fVar23);
  auVar27._8_4_ = fVar23 * 0.0 - fVar29 * 0.0;
  auVar27._12_4_ = fVar23 * 0.0 - fVar29 * 0.0;
  auVar16._4_4_ = fVar36;
  auVar16._0_4_ = fVar36;
  auVar16._8_4_ = fVar30;
  auVar16._12_4_ = fVar30;
  auVar33 = divps(auVar27,auVar16);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11->col = this->Col;
  pIVar11[1].pos.x = fVar21;
  pIVar11[1].pos.y = fVar23;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11[1].col = this->Col;
  pIVar11[2].pos = auVar33._0_8_;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11[2].col = this->Col;
  pIVar11[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11[3].col = this->Col;
  IVar4.y = fVar24;
  IVar4.x = fVar22;
  pIVar11[4].pos = IVar4;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar11 + 5;
  uVar7 = DrawList->_VtxCurrentIdx;
  puVar12 = DrawList->_IdxWritePtr;
  *puVar12 = uVar7;
  uVar19 = -(uint)(fVar29 < fVar34 && fVar23 < fVar24 || fVar24 < fVar23 && fVar34 < fVar29) & 1;
  puVar12[1] = uVar7 + uVar19 + 1;
  puVar12[2] = DrawList->_VtxCurrentIdx + 3;
  puVar12[3] = DrawList->_VtxCurrentIdx + 1;
  puVar12[4] = (uVar19 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar12[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar12 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  (this->P11).x = fVar21;
  (this->P11).y = fVar23;
  (this->P12).x = fVar22;
  (this->P12).y = fVar24;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }